

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe.cc
# Opt level: O0

void __thiscall
bloaty::pe::PEObjectFile::ProcessFile
          (PEObjectFile *this,
          vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> *sinks)

{
  bool bVar1;
  reference ppRVar2;
  RangeSink *in_RDI;
  RangeSink *sink;
  const_iterator __end2;
  const_iterator __begin2;
  vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> *__range2;
  RangeSink *in_stack_000000d8;
  PeFile *in_stack_000000e0;
  vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  DataSource in_stack_ffffffffffffffc4;
  RangeSink *this_00;
  __normal_iterator<bloaty::RangeSink_*const_*,_std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (RangeSink **)
       std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>::begin
                 (in_stack_ffffffffffffffb8);
  std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>::end
            (in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<bloaty::RangeSink_*const_*,_std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (__normal_iterator<bloaty::RangeSink_*const_*,_std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) {
      return;
    }
    ppRVar2 = __gnu_cxx::
              __normal_iterator<bloaty::RangeSink_*const_*,_std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>_>
              ::operator*(local_20);
    this_00 = *ppRVar2;
    in_stack_ffffffffffffffc4 = RangeSink::data_source(this_00);
    if ((in_stack_ffffffffffffffc4 < kInputFiles) || (1 < in_stack_ffffffffffffffc4 - kSections))
    break;
    std::unique_ptr<bloaty::pe::PeFile,_std::default_delete<bloaty::pe::PeFile>_>::operator*
              ((unique_ptr<bloaty::pe::PeFile,_std::default_delete<bloaty::pe::PeFile>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    ParseSections((PeFile *)this_00,in_RDI);
    std::unique_ptr<bloaty::pe::PeFile,_std::default_delete<bloaty::pe::PeFile>_>::operator*
              ((unique_ptr<bloaty::pe::PeFile,_std::default_delete<bloaty::pe::PeFile>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    AddCatchAll(in_stack_000000e0,in_stack_000000d8);
    __gnu_cxx::
    __normal_iterator<bloaty::RangeSink_*const_*,_std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>_>
    ::operator++(local_20);
  }
  Throw((char *)this_00,(int)((ulong)in_RDI >> 0x20));
}

Assistant:

void ProcessFile(const std::vector<RangeSink*>& sinks) const override {
    for (auto sink : sinks) {
      switch (sink->data_source()) {
        case DataSource::kSegments:
          // TODO(mj): sections: list out imports and other stuff!
        case DataSource::kSections:
          ParseSections(*pe_file, sink);
          break;
        case DataSource::kSymbols:
        case DataSource::kRawSymbols:
        case DataSource::kShortSymbols:
        case DataSource::kFullSymbols:
          // TODO(mj): Generate symbols from debug info, exports, imports, tls
          // data, relocations, resources ...
        case DataSource::kArchiveMembers:
        case DataSource::kCompileUnits:
        case DataSource::kInlines:
        default:
          THROW("PE doesn't support this data source");
      }
      AddCatchAll(*pe_file, sink);
    }
  }